

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

void __thiscall
ft::multiset<int,_ft::less<int>,_ft::allocator<int>_>::multiset
          (multiset<int,_ft::less<int>,_ft::allocator<int>_> *this,
          multiset<int,_ft::less<int>,_ft::allocator<int>_> *other)

{
  const_iterator local_58;
  const_iterator local_30;
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *local_18;
  multiset<int,_ft::less<int>,_ft::allocator<int>_> *other_local;
  multiset<int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  
  local_18 = (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)other;
  other_local = this;
  setBase<int,_ft::less<int>,_ft::allocator<int>_>::setBase
            (&this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>,
             &other->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>);
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>._vptr_treeBase =
       (_func_int **)&PTR__multiset_0011abd0;
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::begin(&local_30,local_18);
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end(&local_58,local_18);
  multiset<int,ft::less<int>,ft::allocator<int>>::
  insert<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>>
            ((multiset<int,ft::less<int>,ft::allocator<int>> *)this,&local_30,&local_58,(type *)0x0)
  ;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~constTreeIterator(&local_58);
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~constTreeIterator(&local_30);
  return;
}

Assistant:

multiset(multiset const & other):
		base(other) {
		this->insert(other.begin(), other.end());
	}